

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O0

void __thiscall jaegertracing::net::URI_testPrint_Test::TestBody(URI_testPrint_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_288 [8];
  Message local_280 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  allocator local_231;
  string local_230 [32];
  string local_210 [136];
  ostringstream local_188 [8];
  ostringstream oss;
  URI_testPrint_Test *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"localhost",&local_231);
  jaegertracing::net::URI::parse(local_210);
  ::operator<<((ostream *)local_188,(URI *)local_210);
  URI::~URI((URI *)local_210);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<char[59],std::__cxx11::string>
            ((EqHelper<false> *)local_258,
             "\"{ scheme=\\\"\\\"\" \", host=\\\"\\\"\" \", port=0\" \", path=\\\"localhost\\\"\" \", query=\\\"\\\" }\""
             ,"oss.str()",
             (char (*) [59])"{ scheme=\"\", host=\"\", port=0, path=\"localhost\", query=\"\" }",
             &local_278);
  std::__cxx11::string::~string((string *)&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              (local_288,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=(local_288,local_280);
    testing::internal::AssertHelper::~AssertHelper(local_288);
    testing::Message::~Message(local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

TEST(URI, testPrint)
{
    std::ostringstream oss;
    oss << URI::parse("localhost");
    ASSERT_EQ(
        "{ scheme=\"\""
        ", host=\"\""
        ", port=0"
        ", path=\"localhost\""
        ", query=\"\" }",
        oss.str());
}